

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O2

void initialize(void)

{
  int iVar1;
  undefined8 uVar2;
  FILE *__stream;
  char *__format;
  
  initialized = 1;
  iVar1 = SDL_Init(0x2020);
  if (iVar1 < 0) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/render.c",
            0x37);
    __stream = _stderr;
    uVar2 = SDL_GetError();
    __format = "SDL couldn\'t initialize! %s\n\x1b[0;m";
  }
  else {
    window = (SDL_Window *)
             SDL_CreateWindow("dgb gba",0x1fff0000,0x1fff0000,SCREEN_SCALE * 0xf0,
                              SCREEN_SCALE * 0xa0,4);
    window_id = SDL_GetWindowID(window);
    renderer = (SDL_Renderer *)SDL_CreateRenderer(window,0xffffffffffffffff,6);
    buffer = (SDL_Texture *)SDL_CreateTexture(renderer,0x16862004,1,0xf0,0xa0);
    if (renderer != (SDL_Renderer *)0x0) {
      SDL_RenderSetScale((float)SCREEN_SCALE,(float)SCREEN_SCALE);
      return;
    }
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/render.c",
            0x46);
    __stream = _stderr;
    uVar2 = SDL_GetError();
    __format = "SDL couldn\'t create a renderer! %s\n\x1b[0;m";
  }
  fprintf(__stream,__format,uVar2);
  exit(1);
}

Assistant:

void initialize() {
    initialized = true;
    if (SDL_Init(SDL_INIT_VIDEO | SDL_INIT_GAMECONTROLLER) < 0) {
        logfatal("SDL couldn't initialize! %s", SDL_GetError());
    }

    window = SDL_CreateWindow("dgb gba",
            SDL_WINDOWPOS_UNDEFINED,
            SDL_WINDOWPOS_UNDEFINED,
            GBA_SCREEN_X * SCREEN_SCALE,
            GBA_SCREEN_Y * SCREEN_SCALE,
            SDL_WINDOW_SHOWN);
    window_id = SDL_GetWindowID(window);

    renderer = SDL_CreateRenderer(window, -1, SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC);
    buffer = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ARGB32, SDL_TEXTUREACCESS_STREAMING, GBA_SCREEN_X, GBA_SCREEN_Y);

    if (renderer == NULL) {
        logfatal("SDL couldn't create a renderer! %s", SDL_GetError());
    }

    SDL_RenderSetScale(renderer, SCREEN_SCALE, SCREEN_SCALE);
}